

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void move_pos(lzma_mf *mf)

{
  uint32_t uVar1;
  lzma_mf *mf_local;
  
  uVar1 = mf->cyclic_pos + 1;
  mf->cyclic_pos = uVar1;
  if (uVar1 == mf->cyclic_size) {
    mf->cyclic_pos = 0;
  }
  mf->read_pos = mf->read_pos + 1;
  if (mf->read_pos <= mf->write_pos) {
    if (mf->read_pos + mf->offset == -1) {
      normalize(mf);
    }
    return;
  }
  __assert_fail("mf->read_pos <= mf->write_pos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0x9c,"void move_pos(lzma_mf *)");
}

Assistant:

static void
move_pos(lzma_mf *mf)
{
	if (++mf->cyclic_pos == mf->cyclic_size)
		mf->cyclic_pos = 0;

	++mf->read_pos;
	assert(mf->read_pos <= mf->write_pos);

	if (unlikely(mf->read_pos + mf->offset == UINT32_MAX))
		normalize(mf);
}